

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  int iVar3;
  undefined1 auVar4 [8];
  size_t sVar5;
  ostream *this;
  long *plVar6;
  list<CCard,_std::allocator<CCard>_> local_b8;
  list<CCard,_std::allocator<CCard>_> local_a0;
  undefined1 local_88 [8];
  deck_t first;
  undefined1 local_68 [8];
  deck_t second;
  long local_40 [2];
  
  local_88 = (undefined1  [8])local_88;
  first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_68 = (undefined1  [8])local_68;
  second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)local_88;
  second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)local_68;
  read_deck((deck_t *)local_88);
  read_deck((deck_t *)local_68);
  second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size = (size_t)local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size,
             "first player","");
  dump_deck((string *)
            &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size,
            (deck_t *)local_88);
  if ((long *)second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size !=
      local_40) {
    operator_delete((void *)second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.
                            _M_size,local_40[0] + 1);
  }
  second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size = (size_t)local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size,
             "second player","");
  dump_deck((string *)
            &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size,
            (deck_t *)local_68);
  if ((long *)second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size !=
      local_40) {
    operator_delete((void *)second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.
                            _M_size,local_40[0] + 1);
  }
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::list
            (&local_b8,(list<CCard,_std::allocator<CCard>_> *)local_88);
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::list
            (&local_a0,(list<CCard,_std::allocator<CCard>_> *)local_68);
  first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size =
       (size_t)solve((deck_t *)&local_b8,(deck_t *)&local_a0);
  while (local_a0.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_a0) {
    p_Var1 = (((_List_base<CCard,_std::allocator<CCard>_> *)
              &(local_a0.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.
                super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base.
             _M_next;
    operator_delete(local_a0.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.
                    super__List_node_base._M_next,0x18);
    local_a0.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.super__List_node_base.
    _M_next = p_Var1;
  }
  while (local_b8.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_b8) {
    p_Var1 = (((_List_base<CCard,_std::allocator<CCard>_> *)
              &(local_b8.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.
                super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base.
             _M_next;
    operator_delete(local_b8.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.
                    super__List_node_base._M_next,0x18);
    local_b8.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.super__List_node_base.
    _M_next = p_Var1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"solution has been found",0x17);
  sVar5 = first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  iVar3 = (int)sVar5;
  if (iVar3 - 1U < 2) {
    this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
    plVar6 = (long *)std::ostream::operator<<(this,(int)(sVar5 >> 0x20));
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  }
  else {
    plVar6 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PAT",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  }
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  auVar4 = local_68;
  while (p_Var1 = (_List_node_base *)local_88, auVar4 != (undefined1  [8])local_68) {
    p_Var1 = (((_List_base<CCard,_std::allocator<CCard>_> *)&((_List_node_base *)auVar4)->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete((void *)auVar4,0x18);
    auVar4 = (undefined1  [8])p_Var1;
  }
  while (p_Var1 != (_List_node_base *)local_88) {
    p_Var2 = (((_List_base<CCard,_std::allocator<CCard>_> *)&p_Var1->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var1,0x18);
    p_Var1 = p_Var2;
  }
  return 0;
}

Assistant:

int main()
{
    try
    {
    	deck_t first;
    	deck_t second;
    	
    	read_deck(first);
    	read_deck(second);

        dump_deck("first player", first);
        dump_deck("second player", second);
    	
    	solution_t s = solve(first, second);
    	std::cerr << "solution has been found" << std::endl;
    	
    	switch (s.first)
    	{
    	    case 1:
    	    case 2:
    	        std::cout << s.first << " " << s.second << std::endl;
    	        break;
    
            default:	        
    	        std::cout << "PAT" << std::endl;
    	}
    }
    catch (const std::exception& e)
    {
        std::cerr << e.what() << std::endl;
    }
	
	return 0;
}